

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_cancellation_impl.cc
# Opt level: O3

int __thiscall webrtc::EchoCancellationImpl::Enable(EchoCancellationImpl *this,bool enable)

{
  StreamProperties *pSVar1;
  ostream *poVar2;
  CritScope cs_capture;
  CritScope cs_render;
  CritScope CStack_198;
  CritScope local_190;
  FatalMessage local_188;
  
  rtc::CritScope::CritScope(&local_190,this->crit_render_);
  rtc::CritScope::CritScope(&CStack_198,this->crit_capture_);
  if ((enable) && (this->enabled_ == false)) {
    this->enabled_ = enable;
    pSVar1 = (this->stream_properties_)._M_t.
             super___uniq_ptr_impl<webrtc::EchoCancellationImpl::StreamProperties,_std::default_delete<webrtc::EchoCancellationImpl::StreamProperties>_>
             ._M_t.
             super__Tuple_impl<0UL,_webrtc::EchoCancellationImpl::StreamProperties_*,_std::default_delete<webrtc::EchoCancellationImpl::StreamProperties>_>
             .super__Head_base<0UL,_webrtc::EchoCancellationImpl::StreamProperties_*,_false>.
             _M_head_impl;
    if (pSVar1 == (StreamProperties *)0x0) {
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/echo_cancellation_impl.cc"
                 ,0x10b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_188,"Check failed: stream_properties_",0x20);
      std::ios::widen((char)(ostream *)&local_188 + (char)*(undefined8 *)(local_188._0_8_ + -0x18));
      std::ostream::put((char)&local_188);
      poVar2 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
      rtc::FatalMessage::~FatalMessage(&local_188);
    }
    Initialize(this,pSVar1->sample_rate_hz,pSVar1->num_reverse_channels,pSVar1->num_output_channels,
               pSVar1->num_proc_channels);
  }
  else {
    this->enabled_ = enable;
  }
  rtc::CritScope::~CritScope(&CStack_198);
  rtc::CritScope::~CritScope(&local_190);
  return 0;
}

Assistant:

int EchoCancellationImpl::Enable(bool enable) {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);

  if (enable && !enabled_) {
    enabled_ = enable;  // Must be set before Initialize() is called.

    // TODO(peah): Simplify once the Enable function has been removed from
    // the public APM API.
    RTC_DCHECK(stream_properties_);
    Initialize(stream_properties_->sample_rate_hz,
               stream_properties_->num_reverse_channels,
               stream_properties_->num_output_channels,
               stream_properties_->num_proc_channels);
  } else {
    enabled_ = enable;
  }
  return AudioProcessing::kNoError;
}